

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O1

unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_> __thiscall
verilogAST::WireReadCounter::process_assign<verilogAST::BlockingAssign>
          (WireReadCounter *this,
          unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
          *node)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long *in_RDX;
  long *local_18;
  
  plVar1 = *(long **)(*in_RDX + 0x20);
  *(undefined8 *)(*in_RDX + 0x20) = 0;
  (**(code **)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BlockingAssign_*,_std::default_delete<verilogAST::BlockingAssign>_>
              .super__Head_base<0UL,_verilogAST::BlockingAssign_*,_false>._M_head_impl)(&local_18);
  plVar3 = local_18;
  local_18 = (long *)0x0;
  plVar2 = *(long **)(*in_RDX + 0x20);
  *(long **)(*in_RDX + 0x20) = plVar3;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x10))();
  }
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 0x10))();
  }
  local_18 = (long *)0x0;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  (this->super_Transformer)._vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
          )(__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> WireReadCounter::process_assign(std::unique_ptr<T> node) {
  node->value = this->visit(std::move(node->value));
  return node;
}